

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall
re2::Prog::MarkSuccessors
          (Prog *this,SparseArray<int> *rootmap,SparseArray<int> *predmap,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *predvec,SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  bool bVar1;
  InstOp IVar2;
  reference pvVar3;
  ostream *poVar4;
  const_iterator piVar5;
  int *piVar6;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RCX;
  Prog *in_RSI;
  Prog *in_RDI;
  SparseSetT<void> *in_R8;
  SparseSetT<void> *in_R9;
  int out;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<int> *__range3;
  Inst *ip;
  int id;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  Prog *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  Prog *in_stack_fffffffffffffd50;
  SparseSetT<void> *in_stack_fffffffffffffd58;
  InstOp in_stack_fffffffffffffd74;
  ostream *in_stack_fffffffffffffd78;
  LogMessage *this_01;
  const_iterator local_208;
  int local_200;
  int local_1fc;
  initializer_list<int> local_1f8;
  initializer_list<int> *local_1e8;
  LogMessage local_1d0;
  Inst *local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  SparseSetT<void> *local_30;
  SparseSetT<void> *local_28;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_20;
  Prog *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_34 = SparseArray<int>::size((SparseArray<int> *)in_RSI);
  SparseArray<int>::set_new
            ((SparseArray<int> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,(int *)0x246082
            );
  start_unanchored(in_RDI);
  bVar1 = SparseArray<int>::has_index
                    ((SparseArray<int> *)in_stack_fffffffffffffd58,
                     (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
  if (!bVar1) {
    start_unanchored(in_RDI);
    local_38 = SparseArray<int>::size((SparseArray<int> *)local_10);
    SparseArray<int>::set_new
              ((SparseArray<int> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
               (int *)0x246106);
  }
  start(in_RDI);
  bVar1 = SparseArray<int>::has_index
                    ((SparseArray<int> *)in_stack_fffffffffffffd58,
                     (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
  if (!bVar1) {
    start(in_RDI);
    local_3c = SparseArray<int>::size((SparseArray<int> *)local_10);
    SparseArray<int>::set_new
              ((SparseArray<int> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
               (int *)0x246178);
  }
  SparseSetT<void>::clear(local_28);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x246192);
  local_40 = start_unanchored(in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40,
             (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
LAB_002461c5:
  do {
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40);
    local_44 = *pvVar3;
    std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)0x246200);
    while (bVar1 = SparseSetT<void>::contains
                             (in_stack_fffffffffffffd58,
                              (int)((ulong)in_stack_fffffffffffffd50 >> 0x20)), !bVar1) {
      SparseSetT<void>::insert_new
                ((SparseSetT<void> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
      local_50 = inst(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
      IVar2 = Inst::opcode(local_50);
      switch(IVar2) {
      case kInstAlt:
      case kInstAltMatch:
        local_200 = Inst::out(local_50);
        local_1fc = Inst::out1(local_50);
        local_1f8._M_array = &local_200;
        local_1f8._M_len = 2;
        local_1e8 = &local_1f8;
        local_208 = std::initializer_list<int>::begin(local_1e8);
        piVar5 = std::initializer_list<int>::end((initializer_list<int> *)in_stack_fffffffffffffd40)
        ;
        for (; local_208 != piVar5; local_208 = local_208 + 1) {
          bVar1 = SparseArray<int>::has_index
                            ((SparseArray<int> *)in_stack_fffffffffffffd58,
                             (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
          if (!bVar1) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(local_20);
            SparseArray<int>::set_new
                      ((SparseArray<int> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
                       (int *)0x24641b);
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::emplace_back<>((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)in_stack_fffffffffffffd40);
          }
          this_00 = local_20;
          piVar6 = SparseArray<int>::get_existing
                             ((SparseArray<int> *)in_stack_fffffffffffffd40,
                              in_stack_fffffffffffffd3c);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[](this_00,(long)*piVar6);
          std::vector<int,std::allocator<int>>::emplace_back<int&>
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50,
                     (int *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        }
        in_stack_fffffffffffffd58 = local_30;
        Inst::out1(local_50);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40,
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        local_44 = Inst::out(local_50);
        break;
      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        in_stack_fffffffffffffd50 = local_10;
        Inst::out(local_50);
        bVar1 = SparseArray<int>::has_index
                          ((SparseArray<int> *)in_stack_fffffffffffffd58,
                           (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
        if (!bVar1) {
          in_stack_fffffffffffffd40 = local_10;
          in_stack_fffffffffffffd4c = Inst::out(local_50);
          SparseArray<int>::size((SparseArray<int> *)local_10);
          SparseArray<int>::set_new
                    ((SparseArray<int> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
                     (int *)0x24653d);
        }
        local_44 = Inst::out(local_50);
        break;
      case kInstMatch:
      case kInstFail:
        goto LAB_002461c5;
      case kInstNop:
        local_44 = Inst::out(local_50);
        break;
      default:
        this_01 = &local_1d0;
        LogMessage::LogMessage(this_01,(char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
        poVar4 = LogMessage::stream(this_01);
        in_stack_fffffffffffffd78 = std::operator<<(poVar4,"unhandled opcode: ");
        in_stack_fffffffffffffd74 = Inst::opcode(local_50);
        std::ostream::operator<<(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
        LogMessage::~LogMessage((LogMessage *)in_stack_fffffffffffffd50);
        goto LAB_002461c5;
      }
    }
  } while( true );
}

Assistant:

void Prog::MarkSuccessors(SparseArray<int>* rootmap,
                          SparseArray<int>* predmap,
                          std::vector<std::vector<int>>* predvec,
                          SparseSet* reachable, std::vector<int>* stk) {
  // Mark the kInstFail instruction.
  rootmap->set_new(0, rootmap->size());

  // Mark the start_unanchored and start instructions.
  if (!rootmap->has_index(start_unanchored()))
    rootmap->set_new(start_unanchored(), rootmap->size());
  if (!rootmap->has_index(start()))
    rootmap->set_new(start(), rootmap->size());

  reachable->clear();
  stk->clear();
  stk->push_back(start_unanchored());
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        // Mark this instruction as a predecessor of each out.
        for (int out : {ip->out(), ip->out1()}) {
          if (!predmap->has_index(out)) {
            predmap->set_new(out, static_cast<int>(predvec->size()));
            predvec->emplace_back();
          }
          (*predvec)[predmap->get_existing(out)].emplace_back(id);
        }
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        // Mark the out of this instruction as a "root".
        if (!rootmap->has_index(ip->out()))
          rootmap->set_new(ip->out(), rootmap->size());
        id = ip->out();
        goto Loop;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }
}